

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
fmt::v5::internal::
udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,void *this,wchar_t (*args) [3],int *args_1)

{
  size_t sVar1;
  basic_string_view<wchar_t> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  wchar_t s [6];
  undefined8 local_858;
  wchar_t awStack_850 [6];
  wchar_t (*local_838 [2]) [3];
  ulong local_828;
  undefined **local_818;
  code **local_810;
  long lStack_808;
  ulong local_800;
  code *local_7f8;
  code *local_7f0;
  
  local_810 = (code **)&local_858;
  local_858._0_4_ = L'{';
  local_858._4_4_ = L'}';
  builtin_wcsncpy(awStack_850,L"c{}",4);
  local_818 = (undefined **)CONCAT44(local_818._4_4_,0xffffffff);
  lStack_808 = 5;
  local_800 = local_800 & 0xffffffff00000000;
  local_7f8 = 
  parse_format_specs<wchar_t[3],fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>
  ;
  local_7f0 = 
  parse_format_specs<int,fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>;
  format_str.size_ = (size_t)&local_818;
  format_str.data_ = (wchar_t *)&DAT_00000005;
  parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&>
            ((internal *)&local_858,format_str,
             (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
             args_1);
  sVar1 = wcslen((wchar_t *)&local_858);
  local_828 = (ulong)(uint)*args_1;
  lStack_808 = 0;
  local_818 = &PTR_grow_002a8d18;
  local_800 = 500;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = (wchar_t *)&local_858;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_838;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t[3],int>
       ::TYPES;
  local_838[0] = args;
  local_810 = &local_7f8;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_818,format_str_00,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_810,(long)local_810 + lStack_808 * 4);
  local_818 = &PTR_grow_002a8d18;
  if (local_810 != &local_7f8) {
    operator_delete(local_810);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }